

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::Texture1DArray::Texture1DArray
          (Texture1DArray *this,TextureFormat *format,int width,int numLayers)

{
  int iVar1;
  ConstPixelBufferAccess *levels;
  int numLayers_local;
  int width_local;
  TextureFormat *format_local;
  Texture1DArray *this_local;
  
  iVar1 = computeMipPyramidLevels(width);
  TextureLevelPyramid::TextureLevelPyramid(&this->super_TextureLevelPyramid,format,iVar1);
  this->m_width = width;
  this->m_numLayers = numLayers;
  iVar1 = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
  levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
            super_ConstPixelBufferAccess;
  Texture1DArrayView::Texture1DArrayView(&this->m_view,iVar1,levels);
  return;
}

Assistant:

Texture1DArray::Texture1DArray (const TextureFormat& format, int width, int numLayers)
	: TextureLevelPyramid	(format, computeMipPyramidLevels(width))
	, m_width				(width)
	, m_numLayers			(numLayers)
	, m_view				(getNumLevels(), getLevels())
{
}